

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

double phyr::scrambledRadicalInverseSpecialized<4363>(uint16_t *perm,uint64_t a)

{
  double *pdVar1;
  ulong in_RSI;
  ushort *in_RDI;
  undefined1 auVar2 [16];
  uint64_t digit;
  uint64_t next;
  double invBaseN;
  uint64_t reversedDigits;
  double invBase;
  double local_40;
  ulong local_38;
  ulong local_30;
  double local_28;
  long local_20;
  undefined8 local_18;
  ulong local_10;
  
  local_18 = 0x3f2e0aadcbc76fe5;
  local_20 = 0;
  local_28 = 1.0;
  local_10 = in_RSI;
  while (local_10 != 0) {
    local_38 = local_10 % 0x110b;
    local_20 = local_20 * 0x110b + (ulong)in_RDI[local_38];
    local_28 = local_28 * 0.00022920009168003668;
    local_30 = local_10 / 0x110b;
    local_10 = local_30;
  }
  auVar2._8_4_ = (int)((ulong)local_20 >> 0x20);
  auVar2._0_8_ = local_20;
  auVar2._12_4_ = 0x45300000;
  local_40 = local_28 *
             ((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0) +
             ((double)*in_RDI * 0.00022920009168003668) / 0.99977079990832);
  pdVar1 = std::min<double>(&local_40,(double *)&OneMinusEpsilon);
  return *pdVar1;
}

Assistant:

static Real scrambledRadicalInverseSpecialized(const uint16_t* perm, uint64_t a) {
    const Real invBase = (Real)1 / (Real)base;
    uint64_t reversedDigits = 0;
    Real invBaseN = 1;

    while (a) {
        uint64_t next = a / base;
        uint64_t digit = a - next * base;
        ASSERT(perm[digit] < base);
        reversedDigits = reversedDigits * base + perm[digit];
        invBaseN *= invBase;
        a = next;
    }
    ASSERT(invBaseN * (reversedDigits + invBase * perm[0] / (1 - invBase)) < 1.00001);
    return std::min(
        invBaseN * (reversedDigits + invBase * perm[0] / (1 - invBase)),
        OneMinusEpsilon);
}